

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMutableRenderBufferTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::anon_unknown_3::MutableRenderBufferTest::init
          (MutableRenderBufferTest *this,EVP_PKEY_CTX *ctx)

{
  NativeDisplay *pNVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  int extraout_EAX;
  Library *egl;
  EGLDisplay pvVar5;
  EGLConfig pvVar6;
  NativeWindowFactory *pNVar7;
  undefined4 extraout_var;
  EGLSurface pvVar8;
  undefined4 extraout_var_00;
  TestError *this_00;
  NotSupportedError *this_01;
  pointer_____offset_0x10___ *ppuVar9;
  EGLint surfaceType;
  EGLint contextAttribList [3];
  undefined4 uStack_b4;
  EGLint attribs [13];
  EGLint attribsNoBit [13];
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar5 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)attribs,"EGL_KHR_mutable_render_buffer",(allocator<char> *)attribsNoBit);
  bVar2 = eglu::hasExtension(egl,pvVar5,(string *)attribs);
  std::__cxx11::string::~string((string *)attribs);
  if (bVar2) {
    attribs[8] = 0x3033;
    attribs[9] = 0x1004;
    attribs[10] = 0x3040;
    attribs[0xb] = 4;
    attribs[4] = 0x3022;
    attribs[5] = 8;
    attribs[6] = 0x3021;
    attribs[7] = 8;
    attribs[0] = 0x3024;
    attribs[1] = 8;
    attribs[2] = 0x3023;
    attribs[3] = 8;
    attribs[0xc] = 0x3038;
    attribsNoBit[8] = 0x3033;
    attribsNoBit[9] = 4;
    attribsNoBit[10] = 0x3040;
    attribsNoBit[0xb] = 4;
    attribsNoBit[4] = 0x3022;
    attribsNoBit[5] = 8;
    attribsNoBit[6] = 0x3021;
    attribsNoBit[7] = 8;
    attribsNoBit[0] = 0x3024;
    attribsNoBit[1] = 8;
    attribsNoBit[2] = 0x3023;
    attribsNoBit[3] = 8;
    attribsNoBit[0xc] = 0x3038;
    if (this->m_enableConfigBit == true) {
      pvVar6 = eglu::chooseSingleConfig(egl,this->m_eglDisplay,attribs);
      this->m_eglConfig = pvVar6;
    }
    else {
      eglu::chooseConfigs((vector<void_*,_std::allocator<void_*>_> *)contextAttribList,egl,
                          this->m_eglDisplay,attribsNoBit);
      for (; (undefined8 *)contextAttribList._0_8_ !=
             (undefined8 *)CONCAT44(uStack_b4,contextAttribList[2]);
          contextAttribList._0_8_ = contextAttribList._0_8_ + 8) {
        (*egl->_vptr_Library[0x19])
                  (egl,this->m_eglDisplay,*(undefined8 *)contextAttribList._0_8_,0x3033);
        dVar4 = (*egl->_vptr_Library[0x1f])(egl);
        eglu::checkError(dVar4,
                         "getConfigAttrib(m_eglDisplay, *config, EGL_SURFACE_TYPE, &surfaceType)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                         ,0x88);
      }
      if (this->m_eglConfig == (EGLConfig)0x0) {
        this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_01,"No config without support for mutable_render_buffer found",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                   ,0x92);
        __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                ((_Vector_base<void_*,_std::allocator<void_*>_> *)contextAttribList);
    }
    pNVar7 = eglu::selectNativeWindowFactory
                       (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine)
    ;
    pvVar5 = this->m_eglDisplay;
    pNVar1 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
             ptr;
    pvVar6 = this->m_eglConfig;
    contextAttribList[2] =
         eglu::parseWindowVisibility
                   (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
    contextAttribList[0] = 0x1e0;
    contextAttribList[1] = 0x1e0;
    iVar3 = (*(pNVar7->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                      (pNVar7,pNVar1,pvVar5,pvVar6,0,contextAttribList);
    this->m_window = (NativeWindow *)CONCAT44(extraout_var,iVar3);
    pvVar8 = eglu::createWindowSurface
                       ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                        super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                        .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var,iVar3),this->m_eglDisplay,
                        this->m_eglConfig,(EGLAttrib *)0x0);
    this->m_eglSurface = pvVar8;
    contextAttribList[0] = 0x3098;
    contextAttribList[1] = 2;
    contextAttribList[2] = 0x3038;
    (**egl->_vptr_Library)(egl,0x30a0);
    iVar3 = (*egl->_vptr_Library[6])(egl,this->m_eglDisplay,this->m_eglConfig,0,contextAttribList);
    this->m_eglContext = (EGLContext)CONCAT44(extraout_var_00,iVar3);
    dVar4 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar4,"eglCreateContext",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                     ,0xa4);
    pvVar8 = this->m_eglSurface;
    if (pvVar8 != (EGLSurface)0x0) {
      (*egl->_vptr_Library[0x27])(egl,this->m_eglDisplay,pvVar8,pvVar8,this->m_eglContext);
      dVar4 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar4,"eglMakeCurrent",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                       ,0xa7);
      EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,&this->m_gl,(ApiType)0x2);
      return extraout_EAX;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"m_eglSurface != EGL_NO_SURFACE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
               ,0xa5);
    ppuVar9 = &tcu::TestError::typeinfo;
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"EGL_KHR_mutable_render_buffer is not supported",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
               ,100);
    ppuVar9 = &tcu::NotSupportedError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar9,tcu::Exception::~Exception);
}

Assistant:

void MutableRenderBufferTest::init (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	// create display
	m_eglDisplay		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());

	if (!eglu::hasExtension(egl, m_eglDisplay, "EGL_KHR_mutable_render_buffer"))
	{
		TCU_THROW(NotSupportedError, "EGL_KHR_mutable_render_buffer is not supported");
	}

	// get mutable render buffer config
	const EGLint	attribs[]	=
	{
        EGL_RED_SIZE,			8,
        EGL_GREEN_SIZE,			8,
        EGL_BLUE_SIZE,			8,
		EGL_ALPHA_SIZE,			8,
		EGL_SURFACE_TYPE,		EGL_WINDOW_BIT | EGL_MUTABLE_RENDER_BUFFER_BIT_KHR,
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_NONE
	};
	const EGLint	attribsNoBit[]	=
	{
        EGL_RED_SIZE,			8,
        EGL_GREEN_SIZE,			8,
        EGL_BLUE_SIZE,			8,
		EGL_ALPHA_SIZE,			8,
		EGL_SURFACE_TYPE,		EGL_WINDOW_BIT,
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_NONE
	};

	if (m_enableConfigBit)
	{
		m_eglConfig = eglu::chooseSingleConfig(egl, m_eglDisplay, attribs);
	}
	else
	{
		const vector<EGLConfig> configs = eglu::chooseConfigs(egl, m_eglDisplay, attribsNoBit);

		for (vector<EGLConfig>::const_iterator config = configs.begin(); config != configs.end(); ++config)
		{
			EGLint surfaceType = -1;
			EGLU_CHECK_CALL(egl, getConfigAttrib(m_eglDisplay, *config, EGL_SURFACE_TYPE, &surfaceType));

			if (!(surfaceType & EGL_MUTABLE_RENDER_BUFFER_BIT_KHR))
			{
				m_eglConfig = *config;
				break;
			}
		}

		if (m_eglConfig == DE_NULL)
			TCU_THROW(NotSupportedError, "No config without support for mutable_render_buffer found");
	}

	// create surface
	const eglu::NativeWindowFactory& factory = eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());
	m_window = factory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_eglDisplay, m_eglConfig, DE_NULL,
									eglu::WindowParams(480, 480, eglu::parseWindowVisibility(m_testCtx.getCommandLine())));
	m_eglSurface = eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *m_window, m_eglDisplay, m_eglConfig, DE_NULL);

	// create context and make current
	const EGLint	contextAttribList[]	=
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	egl.bindAPI(EGL_OPENGL_ES_API);
	m_eglContext = egl.createContext(m_eglDisplay, m_eglConfig, EGL_NO_CONTEXT, contextAttribList);
	EGLU_CHECK_MSG(egl, "eglCreateContext");
	TCU_CHECK(m_eglSurface != EGL_NO_SURFACE);
	egl.makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext);
	EGLU_CHECK_MSG(egl, "eglMakeCurrent");

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));
}